

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O1

void __thiscall ipx::Multistream::~Multistream(Multistream *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ostream)._vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var2);
  p_Var2 = (_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var2);
  *(undefined ***)p_Var2 = &PTR__Multistream_00448a58;
  *(undefined ***)(p_Var2 + 0x60) = &PTR__Multistream_00448a80;
  *(undefined ***)(p_Var2 + 8) = &PTR__multibuffer_00448ab8;
  if (*(void **)(p_Var2 + 0x48) != (void *)0x0) {
    operator_delete(*(void **)(p_Var2 + 0x48));
  }
  *(code **)(p_Var1 + 8) = std::istream::_M_extract<double>;
  std::locale::~locale((locale *)(p_Var1 + 0x40));
  std::ios_base::~ios_base((ios_base *)(p_Var2 + 0x60));
  operator_delete(p_Var1);
  return;
}

Assistant:

Multistream() : std::ostream(nullptr) {
        std::ostream::rdbuf(&mbuffer_);
    }